

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef
BinaryenArrayNewFixed
          (BinaryenModuleRef module,BinaryenHeapType type,BinaryenExpressionRef *values,
          BinaryenIndex numValues)

{
  ArrayNewFixed *pAVar1;
  HeapType local_70;
  Builder local_68 [3];
  BinaryenExpressionRef local_50;
  uint local_44;
  undefined1 local_40 [4];
  BinaryenIndex i;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> vals;
  BinaryenIndex numValues_local;
  BinaryenExpressionRef *values_local;
  BinaryenHeapType type_local;
  BinaryenModuleRef module_local;
  
  vals.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = numValues;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_40);
  for (local_44 = 0;
      local_44 <
      vals.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_; local_44 = local_44 + 1) {
    local_50 = values[local_44];
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_40,&local_50
              );
  }
  wasm::Builder::Builder(local_68,module);
  wasm::HeapType::HeapType(&local_70,type);
  pAVar1 = wasm::Builder::makeArrayNewFixed
                     (local_68,local_70,
                      (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_40);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_40);
  return (BinaryenExpressionRef)pAVar1;
}

Assistant:

BinaryenExpressionRef BinaryenArrayNewFixed(BinaryenModuleRef module,
                                            BinaryenHeapType type,
                                            BinaryenExpressionRef* values,
                                            BinaryenIndex numValues) {
  std::vector<Expression*> vals;
  for (BinaryenIndex i = 0; i < numValues; i++) {
    vals.push_back((Expression*)values[i]);
  }
  return static_cast<Expression*>(
    Builder(*(Module*)module).makeArrayNewFixed(HeapType(type), vals));
}